

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O2

void andnot_test(void)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  bitset_container_t *src_1;
  bitset_container_t *src_2;
  bitset_container_t *bitset;
  bitset_container_t *dst;
  size_t x;
  ulong uVar4;
  
  src_1 = bitset_container_create();
  src_2 = bitset_container_create();
  bitset = bitset_container_create();
  dst = bitset_container_create();
  _assert_true((unsigned_long)src_1,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xec);
  _assert_true((unsigned_long)src_2,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xed);
  _assert_true((unsigned_long)bitset,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xee);
  _assert_true((unsigned_long)dst,"TMP",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xef);
  for (uVar4 = 0; uVar4 < 0x10000; uVar4 = uVar4 + 3) {
    bitset_container_set(src_1,(uint16_t)uVar4);
    bitset_container_set(bitset,(uint16_t)uVar4);
  }
  for (uVar4 = 0; uVar4 < 0x10000; uVar4 = uVar4 + 0x3e) {
    bitset_container_set(src_2,(uint16_t)uVar4);
    bitset_container_remove(bitset,(uint16_t)uVar4);
  }
  iVar2 = bitset_container_compute_cardinality(bitset);
  bitset_container_andnot_nocard(src_1,src_2,dst);
  iVar3 = bitset_container_compute_cardinality(dst);
  _assert_int_equal((long)iVar2,(long)iVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x100);
  _Var1 = bitset_container_equals(bitset,dst);
  _assert_true((ulong)_Var1,"bitset_container_equals(BI, TMP)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x101);
  iVar3 = bitset_container_andnot(src_1,src_2,dst);
  _assert_int_equal((long)iVar2,(long)iVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x103);
  _Var1 = bitset_container_equals(bitset,dst);
  _assert_true((ulong)_Var1,"bitset_container_equals(BI, TMP)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x104);
  bitset_container_free(src_1);
  bitset_container_free(src_2);
  bitset_container_free(bitset);
  bitset_container_free(dst);
  return;
}

Assistant:

DEFINE_TEST(andnot_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* TMP = bitset_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        bitset_container_set(B2, x);
        bitset_container_remove(BI, x);
    }

    const int expected = bitset_container_compute_cardinality(BI);

    bitset_container_andnot_nocard(B1, B2, TMP);

    assert_int_equal(expected, bitset_container_compute_cardinality(TMP));
    assert_true(bitset_container_equals(BI, TMP));

    assert_int_equal(expected, bitset_container_andnot(B1, B2, TMP));
    assert_true(bitset_container_equals(BI, TMP));

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(TMP);
}